

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

bool __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
::has_element(raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
              *this,value_type *elem,size_t hashval)

{
  char *pcVar1;
  ulong uVar2;
  uint uVar3;
  ushort uVar4;
  byte bVar5;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  ulong uVar11;
  bool bVar12;
  __m128i match;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  byte bVar6;
  char cVar15;
  char cVar17;
  char cVar18;
  char cVar19;
  
  if (this->ctrl_ == (ctrl_t *)0x0) {
    bVar5 = 0;
  }
  else {
    uVar2 = this->capacity_;
    if ((uVar2 + 1 & uVar2) != 0) {
      __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                    ,0x95,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
    }
    uVar8 = hashval >> 7 & uVar2;
    bVar6 = (byte)hashval;
    bVar5 = bVar6 & 0x7f;
    auVar13 = ZEXT216(CONCAT11(bVar6,bVar6) & 0x7f7f);
    auVar13 = pshuflw(auVar13,auVar13,0);
    uVar9 = 0;
    do {
      pcVar1 = this->ctrl_ + uVar8;
      cVar15 = auVar13[0];
      auVar16[0] = -(cVar15 == *pcVar1);
      cVar17 = auVar13[1];
      auVar16[1] = -(cVar17 == pcVar1[1]);
      cVar18 = auVar13[2];
      auVar16[2] = -(cVar18 == pcVar1[2]);
      cVar19 = auVar13[3];
      auVar16[3] = -(cVar19 == pcVar1[3]);
      auVar16[4] = -(cVar15 == pcVar1[4]);
      auVar16[5] = -(cVar17 == pcVar1[5]);
      auVar16[6] = -(cVar18 == pcVar1[6]);
      auVar16[7] = -(cVar19 == pcVar1[7]);
      auVar16[8] = -(cVar15 == pcVar1[8]);
      auVar16[9] = -(cVar17 == pcVar1[9]);
      auVar16[10] = -(cVar18 == pcVar1[10]);
      auVar16[0xb] = -(cVar19 == pcVar1[0xb]);
      auVar16[0xc] = -(cVar15 == pcVar1[0xc]);
      auVar16[0xd] = -(cVar17 == pcVar1[0xd]);
      auVar16[0xe] = -(cVar18 == pcVar1[0xe]);
      auVar16[0xf] = -(cVar19 == pcVar1[0xf]);
      uVar4 = (ushort)(SUB161(auVar16 >> 7,0) & 1) | (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe | (ushort)(auVar16[0xf] >> 7) << 0xf;
      bVar12 = uVar4 == 0;
      if (!bVar12) {
        uVar7 = (uint)uVar4;
        do {
          uVar3 = 0;
          if (uVar7 != 0) {
            for (; (uVar7 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
            }
          }
          uVar11 = uVar3 + uVar8 & uVar2;
          bVar10 = *(int *)((long)this->slots_ + uVar11 * 0x10 + 8) == elem->second &&
                   this->slots_[uVar11].value.first == elem->first;
          bVar5 = bVar5 | bVar10;
          if (bVar10) break;
          uVar7 = uVar7 - 1 & uVar7;
          bVar12 = uVar7 == 0;
        } while (!bVar12);
      }
      if (bVar12) {
        auVar14[0] = -(*pcVar1 == -0x80);
        auVar14[1] = -(pcVar1[1] == -0x80);
        auVar14[2] = -(pcVar1[2] == -0x80);
        auVar14[3] = -(pcVar1[3] == -0x80);
        auVar14[4] = -(pcVar1[4] == -0x80);
        auVar14[5] = -(pcVar1[5] == -0x80);
        auVar14[6] = -(pcVar1[6] == -0x80);
        auVar14[7] = -(pcVar1[7] == -0x80);
        auVar14[8] = -(pcVar1[8] == -0x80);
        auVar14[9] = -(pcVar1[9] == -0x80);
        auVar14[10] = -(pcVar1[10] == -0x80);
        auVar14[0xb] = -(pcVar1[0xb] == -0x80);
        auVar14[0xc] = -(pcVar1[0xc] == -0x80);
        auVar14[0xd] = -(pcVar1[0xd] == -0x80);
        auVar14[0xe] = -(pcVar1[0xe] == -0x80);
        auVar14[0xf] = -(pcVar1[0xf] == -0x80);
        if ((((((((((((((((auVar14 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                         (auVar14 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar14 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar14 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar14 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar14 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar14 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar14 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar14 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar14 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar14 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar14 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar14 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar14 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar14 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar14[0xf]
           ) {
          if (uVar2 <= uVar9 + 0x10) {
            __assert_fail("seq.getindex() < capacity_ && \"full table!\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                          ,0x87c,
                          "bool phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass, int>, phmap::priv::StatefulTestingHash, phmap::priv::StatefulTestingEqual, phmap::priv::Alloc<std::pair<const phmap::priv::hash_internal::EnumClass, int>>>::has_element(const value_type &__restrict, size_t) const [Policy = phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass, int>, Hash = phmap::priv::StatefulTestingHash, Eq = phmap::priv::StatefulTestingEqual, Alloc = phmap::priv::Alloc<std::pair<const phmap::priv::hash_internal::EnumClass, int>>]"
                         );
          }
          uVar8 = uVar8 + uVar9 + 0x10 & uVar2;
          bVar12 = true;
          uVar9 = uVar9 + 0x10;
        }
        else {
          bVar12 = false;
          bVar5 = 0;
        }
      }
      else {
        bVar12 = false;
      }
    } while (bVar12);
  }
  return (bool)(bVar5 & 1);
}

Assistant:

bool has_element(const value_type& PHMAP_RESTRICT elem, size_t hashval) const {
        PHMAP_IF_CONSTEXPR (!std_alloc_t::value) {
            // ctrl_ could be nullptr
            if (!ctrl_)
                return false;
        }
        auto seq = probe(hashval);
        while (true) {
            Group g{ctrl_ + seq.offset()};
            for (uint32_t i : g.Match((h2_t)H2(hashval))) {
                if (PHMAP_PREDICT_TRUE(PolicyTraits::element(slots_ + seq.offset((size_t)i)) ==
                                      elem))
                    return true;
            }
            if (PHMAP_PREDICT_TRUE(g.MatchEmpty())) return false;
            seq.next();
            assert(seq.getindex() < capacity_ && "full table!");
        }
        return false;
    }